

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Options *options,FieldDescriptor *field)

{
  float value;
  double value_00;
  CppType CVar1;
  EnumDescriptor *this_00;
  EnumValueDescriptor *pEVar2;
  LogMessage *other;
  long lVar3;
  undefined1 qualified;
  int number;
  int number_00;
  AlphaNum *a;
  cpp *this_01;
  char *pcVar4;
  SubstituteArg *this_02;
  SubstituteArg local_210;
  string local_1e0;
  undefined1 local_1c0 [32];
  SubstituteArg local_1a0;
  SubstituteArg local_170;
  SubstituteArg local_140;
  SubstituteArg local_110;
  SubstituteArg local_e0;
  SubstituteArg local_b0;
  SubstituteArg local_80;
  SubstituteArg local_50;
  
  this_02 = (SubstituteArg *)&stack0xfffffffffffffdb8;
  this_01 = this;
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)options);
  qualified = 0xa8;
  switch(CVar1) {
  case CPPTYPE_INT32:
    Int32ToString_abi_cxx11_
              (__return_storage_ptr__,
               (cpp *)(ulong)*(uint *)((long)&(options->annotation_guard_name).field_2 + 8),number);
    return __return_storage_ptr__;
  case CPPTYPE_INT64:
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffdb8,"PROTOBUF",(allocator *)&local_210);
    Int64ToString(__return_storage_ptr__,(string *)&stack0xfffffffffffffdb8,
                  *(int64 *)((long)&(options->annotation_guard_name).field_2 + 8));
    break;
  case CPPTYPE_UINT32:
    strings::AlphaNum::AlphaNum
              ((AlphaNum *)&stack0xfffffffffffffdb8,
               *(uint *)((long)&(options->annotation_guard_name).field_2 + 8));
    StrCat_abi_cxx11_((string *)&local_210,(protobuf *)&stack0xfffffffffffffdb8,a);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_210,
                   "u");
    goto LAB_00275216;
  case CPPTYPE_UINT64:
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffdb8,"PROTOBUF",(allocator *)&local_210);
    UInt64ToString(__return_storage_ptr__,(string *)&stack0xfffffffffffffdb8,
                   *(uint64 *)((long)&(options->annotation_guard_name).field_2 + 8));
    this_02 = (SubstituteArg *)&stack0xfffffffffffffdb8;
    break;
  case CPPTYPE_DOUBLE:
    value_00 = *(double *)((long)&(options->annotation_guard_name).field_2 + 8);
    if (value_00 < INFINITY) {
      if (-INFINITY < value_00) {
        if (!NAN(value_00)) {
          SimpleDtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)this_01,value_00);
          return __return_storage_ptr__;
        }
        pcVar4 = "std::numeric_limits<double>::quiet_NaN()";
      }
      else {
        pcVar4 = "-std::numeric_limits<double>::infinity()";
      }
    }
    else {
      pcVar4 = "std::numeric_limits<double>::infinity()";
    }
    goto LAB_00275410;
  case CPPTYPE_FLOAT:
    value = *(float *)((long)&(options->annotation_guard_name).field_2 + 8);
    if (value < INFINITY) {
      if (-INFINITY < value) {
        if (!NAN(value)) {
          SimpleFtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)this_01,value);
          lVar3 = std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0x38e02f);
          if (lVar3 == -1) {
            return __return_storage_ptr__;
          }
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        pcVar4 = "std::numeric_limits<float>::quiet_NaN()";
      }
      else {
        pcVar4 = "-std::numeric_limits<float>::infinity()";
      }
    }
    else {
      pcVar4 = "std::numeric_limits<float>::infinity()";
    }
    goto LAB_00275410;
  case CPPTYPE_BOOL:
    pcVar4 = "false";
    if ((options->annotation_guard_name).field_2._M_local_buf[8] != '\0') {
      pcVar4 = "true";
    }
    goto LAB_00275410;
  case CPPTYPE_ENUM:
    this_00 = FieldDescriptor::enum_type((FieldDescriptor *)options);
    ClassName_abi_cxx11_((string *)local_1c0,(cpp *)this_00,(EnumDescriptor *)0x1,(bool)qualified);
    pEVar2 = FieldDescriptor::default_value_enum((FieldDescriptor *)options);
    Int32ToString_abi_cxx11_(&local_1e0,(cpp *)(ulong)*(uint *)(pEVar2 + 0x10),number_00);
    local_1a0.text_ = (char *)0x0;
    local_1a0.size_ = -1;
    local_50.text_ = (char *)0x0;
    local_50.size_ = -1;
    local_80.text_ = (char *)0x0;
    local_80.size_ = -1;
    local_b0.text_ = (char *)0x0;
    local_b0.size_ = -1;
    local_e0.text_ = (char *)0x0;
    local_e0.size_ = -1;
    local_110.text_ = (char *)0x0;
    local_210.text_ = local_1e0._M_dataplus._M_p;
    local_110.size_ = -1;
    local_140.text_ = (char *)0x0;
    local_140.size_ = -1;
    local_170.text_ = (char *)0x0;
    local_210.size_ = (int)local_1e0._M_string_length;
    local_170.size_ = -1;
    strings::Substitute_abi_cxx11_
              (__return_storage_ptr__,(strings *)"static_cast< $0 >($1)",&stack0xfffffffffffffdb8,
               &local_210,&local_1a0,&local_50,&local_80,&local_b0,&local_e0,&local_110,&local_140,
               &local_170,(SubstituteArg *)local_1c0._0_8_);
    std::__cxx11::string::~string((string *)&local_1e0);
    this_02 = (SubstituteArg *)local_1c0;
    break;
  case CPPTYPE_STRING:
    CEscape((string *)&local_1a0,*(string **)((long)&(options->annotation_guard_name).field_2 + 8));
    EscapeTrigraphs((string *)&local_210,(string *)&local_1a0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffdb8,"\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_210);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffdb8,"\"");
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb8);
    std::__cxx11::string::~string((string *)&local_210);
    this_02 = &local_1a0;
    break;
  case CPPTYPE_MESSAGE:
    FieldMessageTypeName_abi_cxx11_
              ((string *)&local_210,(cpp *)options,(FieldDescriptor *)this,
               (Options *)&switchD_00275168::switchdataD_0038dba8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffdb8,"*",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_210);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffdb8,"::internal_default_instance()");
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb8);
LAB_00275216:
    this_02 = &local_210;
    break;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)&stack0xfffffffffffffdb8,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
               ,0x2b5);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&stack0xfffffffffffffdb8,"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)&local_210,other);
    internal::LogMessage::~LogMessage((LogMessage *)&stack0xfffffffffffffdb8);
    pcVar4 = "";
LAB_00275410:
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,pcVar4,(allocator *)&stack0xfffffffffffffdb8);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)this_02);
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValue(const Options& options, const FieldDescriptor* field) {
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return Int32ToString(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      return StrCat(field->default_value_uint32()) + "u";
    case FieldDescriptor::CPPTYPE_INT64:
      return Int64ToString("PROTOBUF", field->default_value_int64());
    case FieldDescriptor::CPPTYPE_UINT64:
      return UInt64ToString("PROTOBUF", field->default_value_uint64());
    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value = field->default_value_double();
      if (value == std::numeric_limits<double>::infinity()) {
        return "std::numeric_limits<double>::infinity()";
      } else if (value == -std::numeric_limits<double>::infinity()) {
        return "-std::numeric_limits<double>::infinity()";
      } else if (value != value) {
        return "std::numeric_limits<double>::quiet_NaN()";
      } else {
        return SimpleDtoa(value);
      }
    }
    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value = field->default_value_float();
      if (value == std::numeric_limits<float>::infinity()) {
        return "std::numeric_limits<float>::infinity()";
      } else if (value == -std::numeric_limits<float>::infinity()) {
        return "-std::numeric_limits<float>::infinity()";
      } else if (value != value) {
        return "std::numeric_limits<float>::quiet_NaN()";
      } else {
        std::string float_value = SimpleFtoa(value);
        // If floating point value contains a period (.) or an exponent
        // (either E or e), then append suffix 'f' to make it a float
        // literal.
        if (float_value.find_first_of(".eE") != string::npos) {
          float_value.push_back('f');
        }
        return float_value;
      }
    }
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_ENUM:
      // Lazy:  Generate a static_cast because we don't have a helper function
      //   that constructs the full name of an enum value.
      return strings::Substitute(
          "static_cast< $0 >($1)", ClassName(field->enum_type(), true),
          Int32ToString(field->default_value_enum()->number()));
    case FieldDescriptor::CPPTYPE_STRING:
      return "\"" +
             EscapeTrigraphs(CEscape(field->default_value_string())) +
             "\"";
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "*" + FieldMessageTypeName(field, options) +
             "::internal_default_instance()";
  }
  // Can't actually get here; make compiler happy.  (We could add a default
  // case above but then we wouldn't get the nice compiler warning when a
  // new type is added.)
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}